

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O1

void __thiscall
Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>::
Compressed_distance_matrix
          (Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0> *this,
          vector<float,_std::allocator<float>_> *_distances)

{
  double dVar1;
  ulong uVar2;
  pointer pfVar3;
  logic_error *this_00;
  pointer ppfVar4;
  int iVar5;
  long lVar6;
  undefined1 auVar7 [16];
  allocator_type local_21;
  
  (this->distances).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start =
       (_distances->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
       super__Vector_impl_data._M_start;
  (this->distances).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (_distances->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  (this->distances).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (_distances->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (_distances->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (_distances->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (_distances->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  lVar6 = ((long)(this->distances).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(this->distances).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start) * 2 + 1;
  auVar7._8_4_ = (int)((ulong)lVar6 >> 0x20);
  auVar7._0_8_ = lVar6;
  auVar7._12_4_ = 0x45300000;
  dVar1 = (auVar7._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0);
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  dVar1 = (dVar1 + 1.0) * 0.5;
  uVar2 = (ulong)dVar1;
  std::vector<float_*,_std::allocator<float_*>_>::vector
            (&this->rows,(long)(dVar1 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2,
             &local_21);
  pfVar3 = (this->distances).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  ppfVar4 = (this->rows).super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar2 = (long)(this->rows).super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)ppfVar4;
  iVar5 = (int)(uVar2 >> 3);
  if ((long)(this->distances).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)pfVar3 >> 2 ==
      (ulong)(((long)(uVar2 * 0x20000000 + -0x100000000) >> 0x20) * (long)iVar5) >> 1) {
    if (1 < iVar5) {
      lVar6 = 1;
      do {
        ppfVar4[lVar6] = pfVar3;
        pfVar3 = pfVar3 + lVar6;
        lVar6 = lVar6 + 1;
        ppfVar4 = (this->rows).super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      } while (lVar6 < (int)((ulong)((long)(this->rows).
                                           super__Vector_base<float_*,_std::allocator<float_*>_>.
                                           _M_impl.super__Vector_impl_data._M_finish - (long)ppfVar4
                                    ) >> 3));
    }
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

Compressed_distance_matrix(std::vector<value_t>&& _distances)
      : distances(std::move(_distances)), rows((1 + std::sqrt(1 + 8 * distances.size())) / 2) {
        GUDHI_assert(distances.size() == (std::size_t)size() * (size() - 1) / 2);
        init_rows();
      }